

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O0

bool InsertElem(LinearList *L,ElementType x,int i)

{
  int iVar1;
  int local_24;
  int j;
  int i_local;
  ElementType x_local;
  LinearList *L_local;
  
  if (((i < 0) || (L->Last < i)) || (L->Last == L->MaxSize)) {
    L_local._7_1_ = false;
  }
  else {
    iVar1 = L->Last;
    while (local_24 = iVar1 + -1, i <= local_24) {
      L->data[iVar1] = L->data[local_24];
      iVar1 = local_24;
    }
    L->data[i] = x;
    L->Last = L->Last + 1;
    L_local._7_1_ = true;
  }
  return L_local._7_1_;
}

Assistant:

bool InsertElem(LinearList *L,ElementType x,int i)  //在表中第i个位置插入值为x的结点
{
    if(i<0 || i > L->Last || L->Last==L->MaxSize)
        return false;  //插入位置不合理，插入失败
    else
    {
        int j;
        for(j = L->Last-1; j >= i; j--)
            L->data[j+1] = L->data[j];  //后移
        L->data[i] = x;  //插入
        L->Last++;       //表长+1
        return true;     //插入成功
    }
}